

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O2

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::Request(ZmqReqRep *this,char *request,size_t size)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar6;
  
  std::make_shared<std::vector<char,std::allocator<char>>>();
  iVar1 = -1;
  lVar3 = std::chrono::_V2::system_clock::now();
  do {
    if (0 < iVar1) {
      uVar2 = 0xffffffff;
      lVar3 = std::chrono::_V2::system_clock::now();
      goto LAB_0061d921;
    }
    iVar1 = zmq_send(*(undefined8 *)(request + 0x28),size);
    lVar4 = std::chrono::_V2::system_clock::now();
  } while ((lVar4 - lVar3) / 1000000000 <= (long)*(int *)request);
  zmq_close(*(undefined8 *)(request + 0x28));
  _Var5._M_pi = extraout_RDX;
  goto LAB_0061d988;
  while( true ) {
    uVar2 = zmq_recv(*(undefined8 *)(request + 0x28),*(long *)(request + 8),
                     *(long *)(request + 0x18) - *(long *)(request + 8),0);
    lVar4 = std::chrono::_V2::system_clock::now();
    if ((long)*(int *)request < (lVar4 - lVar3) / 1000000000) break;
LAB_0061d921:
    if (0 < (int)uVar2) {
      std::vector<char,_std::allocator<char>_>::resize
                (*(vector<char,_std::allocator<char>_> **)this,(ulong)uVar2);
      memcpy((void *)**(undefined8 **)this,*(void **)(request + 8),(ulong)uVar2);
      _Var5._M_pi = extraout_RDX_01;
      goto LAB_0061d988;
    }
  }
  zmq_close(*(undefined8 *)(request + 0x28));
  _Var5._M_pi = extraout_RDX_00;
LAB_0061d988:
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar6.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::Request(const char *request, const size_t size)
{
    auto reply = std::make_shared<std::vector<char>>();

    int ret = -1;
    auto start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_send(m_Socket, request, size, 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(m_Socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_recv(m_Socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(m_Socket);
            return reply;
        }
    }

    reply->resize(ret);
    std::memcpy(reply->data(), m_ReceiverBuffer.data(), ret);
    return reply;
}